

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::(anonymous_namespace)::
     readOrder<unsigned_char,unsigned_int,rr::(anonymous_namespace)::NormalOrder>
               (Vector<unsigned_int,_4> *dst,int size,void *ptr)

{
  uint *puVar1;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  void *pvStack_20;
  uchar aligned [4];
  void *ptr_local;
  int size_local;
  Vector<unsigned_int,_4> *dst_local;
  
  pvStack_20 = ptr;
  ::deMemcpy(&local_24,ptr,(long)size);
  puVar1 = tcu::Vector<unsigned_int,_4>::operator[](dst,0);
  *puVar1 = (uint)local_24;
  if (1 < size) {
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](dst,1);
    *puVar1 = (uint)local_23;
  }
  if (2 < size) {
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](dst,2);
    *puVar1 = (uint)local_22;
  }
  if (3 < size) {
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](dst,3);
    *puVar1 = (uint)local_21;
  }
  return;
}

Assistant:

inline void readOrder (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[Order::T0] = DstScalarType(aligned[0]);
	if (size >= 2) dst[Order::T1] = DstScalarType(aligned[1]);
	if (size >= 3) dst[Order::T2] = DstScalarType(aligned[2]);
	if (size >= 4) dst[Order::T3] = DstScalarType(aligned[3]);
}